

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O1

int avro::parsing::ResolvingGrammarGenerator::bestBranch(NodePtr *writer,NodePtr *reader)

{
  bool bVar1;
  element_type *peVar2;
  shared_count sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar8;
  bool bVar9;
  int local_7c;
  NodePtr local_78;
  ulong local_68;
  NodePtr *local_60;
  element_type *local_58;
  shared_count sStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  shared_count asStack_40 [2];
  ulong uVar7;
  
  local_68 = (ulong)(uint)writer->px->type_;
  local_60 = writer;
  iVar5 = (*reader->px->_vptr_Node[4])();
  uVar7 = CONCAT44(extraout_var,iVar5);
  bVar9 = uVar7 != 0;
  if (bVar9) {
    uVar8 = 0;
    do {
      iVar5 = (*reader->px->_vptr_Node[5])(reader->px,uVar8 & 0xffffffff);
      local_78.px = *(element_type **)CONCAT44(extraout_var_00,iVar5);
      local_78.pn.pi_ = (sp_counted_base *)((long *)CONCAT44(extraout_var_00,iVar5))[1];
      if (local_78.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_78.pn.pi_)->use_count_ = (local_78.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      if ((local_78.px)->type_ == AVRO_NUM_TYPES) {
        resolveSymbol((avro *)&local_58,&local_78);
        sVar3.pi_ = sStack_50.pi_;
        peVar2 = local_58;
        local_58 = (element_type *)0x0;
        sStack_50.pi_ = (sp_counted_base *)0x0;
        local_48 = local_78.px._0_4_;
        uStack_44 = local_78.px._4_4_;
        asStack_40[0].pi_._0_4_ = local_78.pn.pi_._0_4_;
        asStack_40[0].pi_._4_4_ = local_78.pn.pi_._4_4_;
        local_78.px = peVar2;
        local_78.pn.pi_ = sVar3.pi_;
        boost::detail::shared_count::~shared_count(asStack_40);
        boost::detail::shared_count::~shared_count(&sStack_50);
      }
      bVar1 = true;
      if ((Type)local_68 == (local_78.px)->type_) {
        iVar5 = (*(local_78.px)->_vptr_Node[2])();
        if ((char)iVar5 != '\0') {
          iVar5 = (*(local_78.px)->_vptr_Node[3])();
          iVar6 = (*local_60->px->_vptr_Node[3])();
          bVar4 = Name::operator==((Name *)CONCAT44(extraout_var_01,iVar5),
                                   (Name *)CONCAT44(extraout_var_02,iVar6));
          if (!bVar4) goto LAB_00164f1c;
        }
        bVar1 = false;
        local_7c = (int)uVar8;
      }
LAB_00164f1c:
      boost::detail::shared_count::~shared_count(&local_78.pn);
      if (!bVar1) break;
      uVar8 = uVar8 + 1;
      bVar9 = uVar8 < uVar7;
    } while (uVar8 != uVar7);
  }
  if (!bVar9) {
    if (uVar7 != 0) {
      uVar8 = 0;
      iVar5 = (int)local_68;
      do {
        iVar6 = (*reader->px->_vptr_Node[5])(reader->px,uVar8 & 0xffffffff);
        iVar6 = *(int *)(*(long *)CONCAT44(extraout_var_03,iVar6) + 8);
        bVar9 = true;
        if (iVar5 - 3U < 2) {
          if (iVar6 == 5) {
LAB_00164f8e:
            bVar9 = false;
            local_7c = (int)uVar8;
          }
        }
        else if (((int)local_68 == 2) && (iVar6 - 3U < 3)) goto LAB_00164f8e;
        if (!bVar9) {
          return local_7c;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    local_7c = -1;
  }
  return local_7c;
}

Assistant:

int ResolvingGrammarGenerator::bestBranch(const NodePtr& writer,
    const NodePtr& reader)
{
    Type t = writer->type();

    const size_t c = reader->leaves();
    for (size_t j = 0; j < c; ++j) {
        NodePtr r = reader->leafAt(j);
        if (r->type() == AVRO_SYMBOLIC) {
            r = resolveSymbol(r);
        }
        if (t == r->type()) {
            if (r->hasName()) {
                if (r->name() == writer->name()) {
                    return j;
                }
            } else {
                return j;
            }
        }
    }

    for (size_t j = 0; j < c; ++j) {
        const NodePtr& r = reader->leafAt(j);
        Type rt = r->type();
        switch (t) {
        case AVRO_INT:
            if (rt == AVRO_LONG || rt == AVRO_DOUBLE || rt == AVRO_FLOAT) {
                return j;
            }
            break;
        case AVRO_LONG:
        case AVRO_FLOAT:
            if (rt == AVRO_DOUBLE) {
                return j;
            }
            break;
        default:
            break;
        }
    }
    return -1;
}